

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int ed_getvariant(disisa *isa,char *name)

{
  disvariant *pdVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  uVar2 = isa->varsnum;
  if (isa->varsnum < 1) {
    uVar2 = 0;
  }
  lVar3 = 0;
  do {
    lVar5 = lVar3;
    if ((ulong)uVar2 * 0x10 + 0x10 == lVar5 + 0x10) {
      return 0;
    }
    pdVar1 = isa->vars;
    iVar4 = strcmp(name,*(char **)((long)&pdVar1->name + lVar5));
    lVar3 = lVar5 + 0x10;
  } while (iVar4 != 0);
  return *(int *)((long)&pdVar1->vartype + lVar5);
}

Assistant:

int ed_getvariant(const struct disisa *isa, const char *name) {
	int i;
	for (i = 0; i < isa->varsnum; i++)
		if (!strcmp(name, isa->vars[i].name))
			return isa->vars[i].vartype;
	return 0;
}